

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyingAndMergingEmptyPages.cpp
# Opt level: O0

EStatusCode MergeEmptyPageToForm(char **argv,string *inEmptyFileName)

{
  PDFDocumentCopyingContext *pPVar1;
  EStatusCode EVar2;
  LogConfiguration *inLogConfiguration;
  EncryptionOptions *pEVar3;
  PDFPage *this;
  PDFParsingOptions *inOptions;
  PDFFormXObject *this_00;
  XObjectContentContext *this_01;
  ObjectIDType inFormXObjectID;
  ResourcesDictionary *this_02;
  undefined1 local_1088 [8];
  string formName;
  PageContentContext *pageContentContext;
  ObjectIDType formID;
  XObjectContentContext *xobjectContentContext;
  PDFFormXObject *local_1030;
  PDFFormXObject *newFormXObject;
  PDFRectangle local_1008;
  PDFPage *local_fe8;
  PDFPage *page;
  PDFCreationSettings local_f90;
  allocator<char> local_f19;
  string local_f18;
  string local_ef8;
  PDFDocumentCopyingContext *local_ed8;
  PDFDocumentCopyingContext *copyingContext;
  undefined1 local_ec8 [4];
  EStatusCode status;
  PDFWriter pdfWriter;
  string *inEmptyFileName_local;
  char **argv_local;
  
  pdfWriter._3752_8_ = inEmptyFileName;
  PDFWriter::PDFWriter((PDFWriter *)local_ec8);
  local_ed8 = (PDFDocumentCopyingContext *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f18,"MergeEmptyPageToForm.pdf",&local_f19);
  BuildRelativeOutputPath(&local_ef8,argv,&local_f18);
  inLogConfiguration = LogConfiguration::DefaultLogConfiguration();
  pEVar3 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions((EncryptionOptions *)&page,pEVar3);
  PDFCreationSettings::PDFCreationSettings(&local_f90,true,true,(EncryptionOptions *)&page,false);
  copyingContext._4_4_ =
       PDFWriter::StartPDF((PDFWriter *)local_ec8,&local_ef8,ePDFVersion13,inLogConfiguration,
                           &local_f90);
  PDFCreationSettings::~PDFCreationSettings(&local_f90);
  EncryptionOptions::~EncryptionOptions((EncryptionOptions *)&page);
  std::__cxx11::string::~string((string *)&local_ef8);
  std::__cxx11::string::~string((string *)&local_f18);
  std::allocator<char>::~allocator(&local_f19);
  if (copyingContext._4_4_ == eSuccess) {
    this = (PDFPage *)operator_new(0x2b8);
    PDFPage::PDFPage(this);
    local_fe8 = this;
    PDFRectangle::PDFRectangle(&local_1008,0.0,0.0,595.0,842.0);
    PDFPage::SetMediaBox(this,&local_1008);
    PDFRectangle::~PDFRectangle(&local_1008);
    BuildRelativeOutputPath((string *)&newFormXObject,argv,(string *)pdfWriter._3752_8_);
    inOptions = PDFParsingOptions::DefaultPDFParsingOptions();
    local_ed8 = PDFWriter::CreatePDFCopyingContext
                          ((PDFWriter *)local_ec8,(string *)&newFormXObject,inOptions);
    std::__cxx11::string::~string((string *)&newFormXObject);
    if (copyingContext._4_4_ == eSuccess) {
      PDFRectangle::PDFRectangle((PDFRectangle *)&xobjectContentContext,0.0,0.0,297.5,842.0);
      this_00 = PDFWriter::StartFormXObject
                          ((PDFWriter *)local_ec8,(PDFRectangle *)&xobjectContentContext,
                           (double *)0x0);
      PDFRectangle::~PDFRectangle((PDFRectangle *)&xobjectContentContext);
      local_1030 = this_00;
      if (this_00 == (PDFFormXObject *)0x0) {
        copyingContext._4_4_ = eFailure;
      }
      else {
        this_01 = PDFFormXObject::GetContentContext(this_00);
        AbstractContentContext::q(&this_01->super_AbstractContentContext);
        AbstractContentContext::cm(&this_01->super_AbstractContentContext,0.5,0.0,0.0,0.5,0.0,421.0)
        ;
        copyingContext._4_4_ =
             PDFDocumentCopyingContext::MergePDFPageToFormXObject(local_ed8,local_1030,0);
        if (copyingContext._4_4_ == eSuccess) {
          AbstractContentContext::Q(&this_01->super_AbstractContentContext);
          inFormXObjectID = PDFFormXObject::GetObjectID(local_1030);
          copyingContext._4_4_ =
               PDFWriter::EndFormXObjectAndRelease((PDFWriter *)local_ec8,local_1030);
          if (copyingContext._4_4_ == eSuccess) {
            formName.field_2._8_8_ =
                 PDFWriter::StartPageContentContext((PDFWriter *)local_ec8,local_fe8);
            this_02 = PDFPage::GetResourcesDictionary(local_fe8);
            ResourcesDictionary::AddFormXObjectMapping_abi_cxx11_
                      ((string *)local_1088,this_02,inFormXObjectID);
            AbstractContentContext::q((AbstractContentContext *)formName.field_2._8_8_);
            AbstractContentContext::Do
                      ((AbstractContentContext *)formName.field_2._8_8_,(string *)local_1088);
            AbstractContentContext::cm
                      ((AbstractContentContext *)formName.field_2._8_8_,1.0,0.0,0.0,1.0,297.5,0.0);
            AbstractContentContext::Do
                      ((AbstractContentContext *)formName.field_2._8_8_,(string *)local_1088);
            AbstractContentContext::Q((AbstractContentContext *)formName.field_2._8_8_);
            copyingContext._4_4_ =
                 PDFWriter::EndPageContentContext
                           ((PDFWriter *)local_ec8,(PageContentContext *)formName.field_2._8_8_);
            if ((copyingContext._4_4_ == eSuccess) &&
               (copyingContext._4_4_ =
                     PDFWriter::WritePageAndRelease((PDFWriter *)local_ec8,local_fe8),
               copyingContext._4_4_ == eSuccess)) {
              copyingContext._4_4_ = PDFWriter::EndPDF((PDFWriter *)local_ec8);
            }
            std::__cxx11::string::~string((string *)local_1088);
          }
        }
      }
    }
  }
  pPVar1 = local_ed8;
  if (local_ed8 != (PDFDocumentCopyingContext *)0x0) {
    PDFDocumentCopyingContext::~PDFDocumentCopyingContext(local_ed8);
    operator_delete(pPVar1,0xd0);
  }
  EVar2 = copyingContext._4_4_;
  PDFWriter::~PDFWriter((PDFWriter *)local_ec8);
  return EVar2;
}

Assistant:

static EStatusCode MergeEmptyPageToForm(char* argv[], const string& inEmptyFileName)
{
	PDFWriter pdfWriter;
	EStatusCode status;
    PDFDocumentCopyingContext* copyingContext = NULL;
    
	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"MergeEmptyPageToForm.pdf"),
                                    ePDFVersion13);
		if(status != PDFHummus::eSuccess)
			break;
        
        
        // in this test we will merge 2 pages into a PDF form, and place it twice, forming a 2X2 design. amazing.
        
		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));
        
        
        copyingContext = pdfWriter.CreatePDFCopyingContext(BuildRelativeOutputPath(argv,inEmptyFileName));
        if(status != PDFHummus::eSuccess)
            break;
        
        // create form for two pages.
        PDFFormXObject* newFormXObject = pdfWriter.StartFormXObject(PDFRectangle(0,0,297.5,842));
		if(!newFormXObject)
		{
			status = PDFHummus::eFailure;
			break;
		}
        
		XObjectContentContext* xobjectContentContext = newFormXObject->GetContentContext();
        
        xobjectContentContext->q();
        xobjectContentContext->cm(0.5,0,0,0.5,0,421);
        status = copyingContext->MergePDFPageToFormXObject(newFormXObject,0);
        if(status != eSuccess)
            break;
        xobjectContentContext->Q();
        
        ObjectIDType formID = newFormXObject->GetObjectID();
        status = pdfWriter.EndFormXObjectAndRelease(newFormXObject);
        if(status != eSuccess)
            break;
        
        // now place it in the page
        PageContentContext* pageContentContext = pdfWriter.StartPageContentContext(page);
        
        
        string formName = page->GetResourcesDictionary().AddFormXObjectMapping(formID);
        
        pageContentContext->q();
        pageContentContext->Do(formName);
        pageContentContext->cm(1,0,0,1,297.5,0);
        pageContentContext->Do(formName);
        pageContentContext->Q();
        
        status = pdfWriter.EndPageContentContext(pageContentContext);
        if(status != eSuccess)
            break;
        
		status = pdfWriter.WritePageAndRelease(page);
		if(status != PDFHummus::eSuccess)
			break;
        
		status = pdfWriter.EndPDF();
		if(status != PDFHummus::eSuccess)
			break;
	}while(false);
    
    delete copyingContext;
	
	return status;
}